

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.h
# Opt level: O1

bool __thiscall Triangle::intersect(Triangle *this,Ray *ray,Hit *hit,float tmin)

{
  undefined1 *v0;
  int iVar1;
  float *pfVar2;
  Triangle *pTVar3;
  Hit *pHVar4;
  Matrix3f *this_00;
  float fVar5;
  float fVar6;
  bool sg;
  Vector3f R;
  Vector3f tmp;
  Vector3f p;
  Matrix3f L;
  bool local_dd;
  Vector3f local_dc;
  Triangle *local_d0;
  Hit *local_c8;
  undefined1 local_c0 [24];
  Vector3f *local_a8;
  Vector3f local_9c;
  Matrix3f local_90;
  Vector3f local_6c;
  Vector3f local_60;
  Matrix3f local_54;
  
  if (this->empty != false) {
    return false;
  }
  v0 = &this->field_0x74;
  local_c8 = hit;
  operator-((Vector3f *)v0,(Vector3f *)&this->field_0x5c);
  local_d0 = this;
  operator-((Vector3f *)v0,(Vector3f *)&this->field_0x68);
  local_a8 = &ray->d;
  Matrix3f::Matrix3f(&local_54,&ray->d,(Vector3f *)&local_90,&local_dc,true);
  operator-((Vector3f *)v0,&ray->o);
  Matrix3f::inverse(&local_90,&local_54,&local_dd,0.0);
  Matrix3f::operator=(&local_54,&local_90);
  if (local_dd != false) {
    return false;
  }
  ::operator*(&local_90,(Vector3f *)&local_54);
  Vector3f::operator=(&local_dc,(Vector3f *)&local_90);
  pfVar2 = Vector3f::operator[](&local_dc,1);
  fVar5 = *pfVar2;
  pfVar2 = Vector3f::operator[](&local_dc,2);
  if (1.0 < fVar5 + *pfVar2) {
    return false;
  }
  pfVar2 = Vector3f::operator[](&local_dc,1);
  if (*pfVar2 < 0.0) {
    return false;
  }
  pfVar2 = Vector3f::operator[](&local_dc,2);
  if (*pfVar2 < 0.0) {
    return false;
  }
  pfVar2 = Vector3f::operator[](&local_dc,0);
  pHVar4 = local_c8;
  pTVar3 = local_d0;
  fVar5 = *pfVar2;
  if (fVar5 < tmin) {
    return false;
  }
  if (local_c8->t <= fVar5) {
    return false;
  }
  local_c8->t = fVar5;
  local_c8->obj = &local_d0->super_Object;
  if (local_d0->use_n == true) {
    pfVar2 = Vector3f::operator[](&local_dc,1);
    ::operator*(*pfVar2,&local_9c);
    pfVar2 = Vector3f::operator[](&local_dc,2);
    ::operator*(*pfVar2,&local_6c);
    operator+(&local_9c,&local_6c);
    pfVar2 = Vector3f::operator[](&local_dc,1);
    fVar6 = *pfVar2;
    pfVar2 = Vector3f::operator[](&local_dc,2);
    ::operator*((1.0 - fVar6) - *pfVar2,&local_60);
    pHVar4 = local_c8;
    pTVar3 = local_d0;
    operator+((Vector3f *)local_c0,&local_60);
    Vector3f::normalized((Vector3f *)&local_90);
  }
  else {
    Vector3f::Vector3f((Vector3f *)&local_90,(Vector3f *)&local_d0->field_0x38);
  }
  Vector3f::operator=(&pHVar4->norm,(Vector3f *)&local_90);
  iVar1 = (*((pTVar3->super_Object).m)->_vptr_Material[2])();
  if ((char)iVar1 == '\0') {
    this_00 = &local_90;
    fVar5 = 0.0;
    fVar6 = 0.0;
  }
  else {
    if (pTVar3->has_uv != false) {
      pfVar2 = Vector3f::operator[](&local_dc,1);
      ::operator*((Vector2f *)local_c0,*pfVar2);
      pfVar2 = Vector3f::operator[](&local_dc,2);
      ::operator*((Vector2f *)&local_9c,*pfVar2);
      operator+((Vector2f *)local_c0,(Vector2f *)&local_9c);
      pfVar2 = Vector3f::operator[](&local_dc,1);
      fVar5 = *pfVar2;
      pfVar2 = Vector3f::operator[](&local_dc,2);
      ::operator*((Vector2f *)&local_6c,(1.0 - fVar5) - *pfVar2);
      this_00 = &local_90;
      operator+((Vector2f *)(local_c0 + 0xc),(Vector2f *)&local_6c);
      goto LAB_001c1589;
    }
    local_c8 = (Hit *)&pTVar3->matrix;
    ::operator*(&local_9c,fVar5);
    operator+(&ray->o,&local_9c);
    operator-((Vector3f *)local_c0,&pTVar3->o);
    ::operator*(&local_90,(Vector3f *)local_c8);
    ::operator*((Vector3f *)local_c0,fVar5);
    operator+(&ray->o,(Vector3f *)local_c0);
    pfVar2 = Vector3f::operator[]((Vector3f *)&local_90,1);
    fVar5 = *pfVar2;
    pfVar2 = Vector3f::operator[]((Vector3f *)&local_90,2);
    fVar6 = *pfVar2;
    this_00 = (Matrix3f *)local_c0;
  }
  Vector2f::Vector2f((Vector2f *)this_00,fVar5,fVar6);
LAB_001c1589:
  Vector2f::operator=(&pHVar4->pos,(Vector2f *)this_00);
  return true;
}

Assistant:

bool intersect(const Ray& ray, Hit& hit, float tmin) override {
		if (empty) return 0;
		Matrix3f L(ray.d, v[2] - v[0], v[2] - v[1], 1);
		Vector3f R = v[2] - ray.o;
		bool sg; L = L.inverse(&sg);
		if (sg) return 0; R = L * R;
		if (R[1] + R[2] > 1 || R[1] < 0 || R[2] < 0) return 0;
		float t = R[0];
		if (t < tmin || t >= hit.t) return 0;
		hit.t = t; hit.obj = this;
		hit.norm = use_n?((R[1]*n[0]+R[2]*n[1]+(1-R[1]-R[2])*n[2]).normalized()):n[0];
		if (m->need_coords()) {
			if (!has_uv) {
				Vector3f p = matrix * (ray.o + ray.d * t - o);
				Vector3f tmp = ray.o + ray.d * t;
	//			cerr << tmp[0] << "," << tmp[1] << "," << tmp[2] << ":" << p[1] << "," << p[2] << "\n";
				hit.pos = Vector2f(p[1], p[2]);
			}
			else {
				hit.pos = uv[0] * R[1] + uv[1] * R[2] + uv[2] * (1 - R[1] - R[2]);
			}
		}
		else hit.pos = Vector2f(0, 0);
		return 1;
	}